

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O3

Result_type __thiscall
sig::
Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
::operator()(Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
             *this,int *args)

{
  bool bVar1;
  unique_lock<std::mutex> lock;
  Bound_slot_container slots;
  __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  local_40;
  unique_lock<std::mutex> local_38;
  Bound_slot_container local_28;
  
  bVar1 = Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
          ::enabled((Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
                     *)this);
  if (bVar1) {
    bind_args<int&>(&local_28,this,args);
    local_38._M_device = (mutex_type *)(this + 0xe0);
    local_38._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    std::unique_lock<std::mutex>::unlock(&local_38);
    local_40._M_current =
         local_28.
         super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (local_28.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_28.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      do {
        Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
        ::operator*((Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
                     *)&local_40);
        local_40._M_current = local_40._M_current + 1;
      } while (local_40._M_current !=
               local_28.
               super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              (&local_28);
  }
  return;
}

Assistant:

Result_type operator()(Arguments&&... args) {
        if (!this->enabled()) {
            return Result_type();
        }
        auto slots = bind_args(std::forward<Arguments>(args)...);
        std::unique_lock<Mutex> lock{mtx_};
        auto comb = combiner_;
        lock.unlock();
        return comb(Bound_slot_iterator{std::begin(slots)},
                    Bound_slot_iterator{std::end(slots)});
    }